

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDress2.c
# Opt level: O2

void Abc_NtkDress2(Abc_Ntk_t *pNtk1,Abc_Ntk_t *pNtk2,int nConflictLimit,int fVerbose)

{
  int iVar1;
  abctime aVar2;
  Vec_Ptr_t *vRes;
  abctime aVar3;
  long lVar4;
  
  aVar2 = Abc_Clock();
  vRes = Abc_NtkDressComputeEquivs(pNtk1,pNtk2,nConflictLimit,fVerbose);
  iVar1 = pNtk1->nObjCounts[7];
  aVar3 = Abc_Clock();
  Abc_NtkDressPrintStats(vRes,iVar1,iVar1,aVar3 - aVar2);
  Abc_NtkDress2Transfer(pNtk1,pNtk2,vRes,fVerbose);
  iVar1 = vRes->nSize;
  for (lVar4 = 0; lVar4 < iVar1; lVar4 = lVar4 + 1) {
    if ((Vec_Ptr_t *)vRes->pArray[lVar4] != (Vec_Ptr_t *)0x0) {
      Vec_PtrFree((Vec_Ptr_t *)vRes->pArray[lVar4]);
    }
  }
  Vec_PtrFree(vRes);
  return;
}

Assistant:

void Abc_NtkDress2( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, int nConflictLimit, int fVerbose )
{
    Vec_Ptr_t * vRes;
    abctime clk = Abc_Clock();
    vRes = Abc_NtkDressComputeEquivs( pNtk1, pNtk2, nConflictLimit, fVerbose );
//    Abc_NtkDressPrintEquivs( vRes );
    Abc_NtkDressPrintStats( vRes, Abc_NtkNodeNum(pNtk1), Abc_NtkNodeNum(pNtk1), Abc_Clock() - clk );
    Abc_NtkDress2Transfer( pNtk1, pNtk2, vRes, fVerbose );
    Vec_VecFree( (Vec_Vec_t *)vRes );
}